

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O2

void conversion_operator_suite::get_boolean(void)

{
  bool v;
  type_conflict4 tVar1;
  type_conflict8 tVar2;
  variable data;
  type local_108;
  undefined1 local_e8;
  type local_d0;
  type local_b8;
  type local_98;
  type local_78;
  type local_58;
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  local_38;
  
  local_e8 = 1;
  local_108.__data[0] = '\x01';
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::nullable>
            ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::throw_failed_impl
            ("data.operator nullable()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe18,"void conversion_operator_suite::get_boolean()");
  v = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_108.__align);
  boost::detail::test_impl
            ("bool(data) == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe19,"void conversion_operator_suite::get_boolean()",v);
  tVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                    ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::test_impl
            ("int(data) == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe1a,"void conversion_operator_suite::get_boolean()",tVar1 == 1);
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_108.__align);
  boost::detail::test_impl
            ("float(data) == 1.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe1b,"void conversion_operator_suite::get_boolean()",(bool)(-(tVar2 == 1.0) & 1));
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_58,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::__cxx11::string::~string((string *)&local_58);
  boost::detail::throw_failed_impl
            ("data.operator variable::string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe1e,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_78,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  boost::detail::throw_failed_impl
            ("data.operator variable::wstring_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe21,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_98,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::__cxx11::u16string::~u16string((u16string *)&local_98);
  boost::detail::throw_failed_impl
            ("data.operator variable::u16string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe24,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_b8,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::__cxx11::u32string::~u32string((u32string *)&local_b8);
  boost::detail::throw_failed_impl
            ("data.operator variable::u32string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe27,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
            (&local_d0,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  boost::detail::throw_failed_impl
            ("data.operator variable::array_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe2a,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ((type *)&local_38,(basic_variable<std::allocator<char>> *)&local_108.__align);
  std::
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38);
  boost::detail::throw_failed_impl
            ("data.operator variable::map_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe2d,"void conversion_operator_suite::get_boolean()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_108.__align);
  return;
}

Assistant:

void get_boolean()
{
    variable data(true);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator nullable(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST(bool(data) == true);
    TRIAL_PROTOCOL_TEST(int(data) == 1);
    TRIAL_PROTOCOL_TEST(float(data) == 1.0f);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::wstring_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u16string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u32string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::array_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::map_type(),
                                    error,
                                    "incompatible type");
}